

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-graph.cpp
# Opt level: O1

void __thiscall llm_graph_input_cls::set_input(llm_graph_input_cls *this,llama_ubatch *ubatch)

{
  llama_pooling_type lVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  void *pvVar6;
  llama_seq_id **pplVar7;
  llama_pos *plVar8;
  char cVar9;
  long lVar10;
  char *pcVar11;
  ulong uVar12;
  undefined8 uVar13;
  ulong uVar14;
  long lVar15;
  ulong uVar16;
  long lVar17;
  vector<int,_std::allocator<int>_> last_row;
  vector<int,_std::allocator<int>_> last_pos;
  allocator_type local_65;
  value_type_conflict3 local_64;
  vector<int,_std::allocator<int>_> local_60;
  vector<int,_std::allocator<int>_> local_48;
  
  if ((this->cparams->embeddings == true) &&
     ((lVar1 = this->cparams->pooling_type, lVar1 == LLAMA_POOLING_TYPE_RANK ||
      (lVar1 == LLAMA_POOLING_TYPE_CLS)))) {
    if (this->cls == (ggml_tensor *)0x0) {
      pcVar11 = "cls";
      uVar13 = 0xca;
      goto LAB_001a9949;
    }
    uVar2 = ubatch->n_tokens;
    uVar3 = ubatch->n_seq_tokens;
    uVar4 = ubatch->n_seqs;
    cVar9 = ggml_backend_buffer_is_host(this->cls->buffer);
    if (cVar9 == '\0') {
      pcVar11 = "ggml_backend_buffer_is_host(cls->buffer)";
      uVar13 = 0xcb;
      goto LAB_001a9949;
    }
    pvVar6 = this->cls->data;
    lVar10 = ggml_element_size();
    memset(pvVar6,0,lVar10 * (ulong)uVar2);
    if ((ulong)uVar4 != 0) {
      pplVar7 = ubatch->seq_id;
      lVar10 = 0;
      uVar12 = 0;
      do {
        iVar5 = *pplVar7[uVar12];
        if ((long)(ulong)uVar2 <= (long)iVar5) {
          pcVar11 = 
          "seq_id < n_tokens && \"seq_id cannot be larger than n_tokens with pooling_type == CLS or RANK\""
          ;
          uVar13 = 0xd4;
          goto LAB_001a9949;
        }
        if (uVar3 != 0) {
          plVar8 = ubatch->pos;
          uVar14 = (ulong)uVar3;
          lVar15 = lVar10;
          do {
            if (plVar8[lVar15] == 0) {
              *(int *)((long)pvVar6 + (long)iVar5 * 4) = (int)lVar15;
            }
            lVar15 = lVar15 + 1;
            uVar14 = uVar14 - 1;
          } while (uVar14 != 0);
        }
        uVar12 = uVar12 + 1;
        lVar10 = lVar10 + (ulong)uVar3;
      } while (uVar12 != uVar4);
    }
  }
  if ((this->cparams->embeddings != true) ||
     (this->cparams->pooling_type != LLAMA_POOLING_TYPE_LAST)) {
    return;
  }
  if (this->cls == (ggml_tensor *)0x0) {
    pcVar11 = "cls";
    uVar13 = 0xe5;
  }
  else {
    uVar12 = (ulong)ubatch->n_tokens;
    uVar2 = ubatch->n_seq_tokens;
    uVar3 = ubatch->n_seqs;
    cVar9 = ggml_backend_buffer_is_host(this->cls->buffer);
    if (cVar9 != '\0') {
      pvVar6 = this->cls->data;
      lVar10 = ggml_element_size();
      memset(pvVar6,0,lVar10 * uVar12);
      local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start._0_4_ = 0xffffffff;
      std::vector<int,_std::allocator<int>_>::vector
                (&local_48,uVar12,(value_type_conflict3 *)&local_60,(allocator_type *)&local_64);
      local_64 = -1;
      std::vector<int,_std::allocator<int>_>::vector(&local_60,uVar12,&local_64,&local_65);
      if ((ulong)uVar3 != 0) {
        pplVar7 = ubatch->seq_id;
        lVar10 = 0;
        uVar14 = 0;
        do {
          lVar15 = (long)*pplVar7[uVar14];
          if ((long)uVar12 <= lVar15) {
            ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-graph.cpp"
                       ,0xf2,"GGML_ASSERT(%s) failed",
                       "seq_id < n_tokens && \"seq_id cannot be larger than n_tokens with pooling_type == LAST\""
                      );
          }
          if (uVar2 != 0) {
            plVar8 = ubatch->pos;
            uVar16 = (ulong)uVar2;
            lVar17 = lVar10;
            do {
              if (local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[lVar15] <= plVar8[lVar17]) {
                local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[lVar15] = plVar8[lVar17];
                *(int *)(CONCAT44(local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start._4_4_,
                                  local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start._0_4_) + lVar15 * 4) =
                     (int)lVar17;
              }
              lVar17 = lVar17 + 1;
              uVar16 = uVar16 - 1;
            } while (uVar16 != 0);
          }
          uVar14 = uVar14 + 1;
          lVar10 = lVar10 + (ulong)uVar2;
        } while (uVar14 != uVar3);
      }
      if (uVar12 != 0) {
        uVar14 = 0;
        do {
          iVar5 = *(int *)(CONCAT44(local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_start._4_4_,
                                    local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_start._0_4_) + uVar14 * 4);
          if (-1 < iVar5) {
            *(int *)((long)pvVar6 + uVar14 * 4) = iVar5;
          }
          uVar14 = uVar14 + 1;
        } while (uVar12 != uVar14);
      }
      pvVar6 = (void *)CONCAT44(local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start._4_4_,
                                local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start._0_4_);
      if (pvVar6 != (void *)0x0) {
        operator_delete(pvVar6,(long)local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_end_of_storage - (long)pvVar6);
      }
      if (local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start == (pointer)0x0) {
        return;
      }
      operator_delete(local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
      return;
    }
    pcVar11 = "ggml_backend_buffer_is_host(cls->buffer)";
    uVar13 = 0xe6;
  }
LAB_001a9949:
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-graph.cpp"
             ,uVar13,"GGML_ASSERT(%s) failed",pcVar11);
}

Assistant:

void llm_graph_input_cls::set_input(const llama_ubatch * ubatch) {
    if (cparams.embeddings && (
                cparams.pooling_type == LLAMA_POOLING_TYPE_CLS ||
                cparams.pooling_type == LLAMA_POOLING_TYPE_RANK)) {
        const int64_t n_tokens     = ubatch->n_tokens;
        const int64_t n_seq_tokens = ubatch->n_seq_tokens;
        const int64_t n_seqs       = ubatch->n_seqs;

        GGML_ASSERT(cls);
        GGML_ASSERT(ggml_backend_buffer_is_host(cls->buffer));

        uint32_t * data = (uint32_t *) cls->data;
        memset(cls->data, 0, n_tokens * ggml_element_size(cls));

        for (int s = 0; s < n_seqs; ++s) {
            const llama_seq_id seq_id = ubatch->seq_id[s][0];

            // TODO: adapt limits to n_seqs when ubatch->equal_seqs is true
            GGML_ASSERT(seq_id < n_tokens && "seq_id cannot be larger than n_tokens with pooling_type == CLS or RANK");

            for (int i = 0; i < n_seq_tokens; ++i) {
                const llama_pos pos = ubatch->pos[s*n_seq_tokens + i];

                if (pos == 0) {
                    data[seq_id] = s*n_seq_tokens + i;
                }
            }
        }
    }

    if (cparams.embeddings && cparams.pooling_type == LLAMA_POOLING_TYPE_LAST) {
        const int64_t n_tokens     = ubatch->n_tokens;
        const int64_t n_seq_tokens = ubatch->n_seq_tokens;
        const int64_t n_seqs       = ubatch->n_seqs;

        GGML_ASSERT(cls);
        GGML_ASSERT(ggml_backend_buffer_is_host(cls->buffer));

        uint32_t * data = (uint32_t *) cls->data;
        memset(cls->data, 0, n_tokens * ggml_element_size(cls));

        std::vector<int> last_pos(n_tokens, -1);
        std::vector<int> last_row(n_tokens, -1);

        for (int s = 0; s < n_seqs; ++s) {
            const llama_seq_id seq_id = ubatch->seq_id[s][0];

            // TODO: adapt limits to n_seqs when ubatch->equal_seqs is true
            GGML_ASSERT(seq_id < n_tokens && "seq_id cannot be larger than n_tokens with pooling_type == LAST");

            for (int i = 0; i < n_seq_tokens; ++i) {
                const llama_pos pos = ubatch->pos[s*n_seq_tokens + i];

                if (pos >= last_pos[seq_id]) {
                    last_pos[seq_id] = pos;
                    last_row[seq_id] = s*n_seq_tokens + i;
                }
            }
        }

        for (int i = 0; i < n_tokens; ++i) {
            if (last_row[i] >= 0) {
                data[i] = last_row[i];
            }
        }
    }
}